

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpio.c
# Opt level: O2

int main(int argc,char **argv)

{
  __uid_t _Var1;
  int iVar2;
  wchar_t wVar3;
  int iVar4;
  char *pcVar5;
  int *piVar6;
  long lVar7;
  size_t __n;
  char *__dest;
  lafe_line_reader *plVar8;
  archive_entry_linkresolver *res;
  la_int64_t lVar9;
  cpio _cpio;
  archive_entry *local_d8;
  char *errmsg;
  char *tptr;
  archive_entry *local_c0;
  cpio_owner owner;
  
  memset(&_cpio,0,0x128);
  _cpio.buff = main::buff;
  _cpio.buff_size = 0x4000;
  sigemptyset((sigset_t *)&owner.uname);
  owner.uid = 1;
  owner.gid = 0;
  sigaction(0xd,(sigaction *)&owner,(sigaction *)0x0);
  lafe_setprogname(*argv,"bsdcpio");
  pcVar5 = setlocale(6,"");
  if (pcVar5 == (char *)0x0) {
    lafe_warnc(0,"Failed to set default locale");
  }
  _cpio.uid_override = -1;
  _cpio.uname_override = (char *)0x0;
  _cpio.gid_override = -1;
  _cpio.gname_override = (char *)0x0;
  _cpio.mode = 0;
  _cpio.compress = 0;
  _cpio.verbose = 0;
  _cpio.extract_flags = 0x10f62;
  _cpio.argc = argc;
  _cpio.argv = argv;
  _Var1 = geteuid();
  if (_Var1 == 0) {
    _cpio.extract_flags = _cpio.extract_flags | 1;
  }
  _cpio.bytes_per_block = 0x200;
  _cpio.filename = (char *)0x0;
  _cpio.matching = archive_match_new();
  if (_cpio.matching == (archive *)0x0) {
    pcVar5 = "Out of memory";
LAB_0010a2f8:
    lafe_errc(1,0,pcVar5);
  }
  iVar4 = _cpio.bytes_per_block;
LAB_001097ea:
  _cpio.bytes_per_block = iVar4;
  iVar2 = cpio_getopt(&_cpio);
  iVar4 = _cpio.bytes_per_block;
  switch(iVar2) {
  case 0x30:
    _cpio.option_null = '\x01';
    goto LAB_001097ea;
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x38:
  case 0x39:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x44:
  case 0x47:
  case 0x4b:
  case 0x4d:
  case 0x4e:
  case 0x50:
  case 0x51:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x62:
  case 0x65:
  case 0x67:
  case 0x6b:
  case 0x71:
  case 0x73:
  case 0x77:
  case 0x78:
switchD_00109801_caseD_31:
    usage();
  case 0x36:
    _cpio.option_pwb = 1;
    goto LAB_001097ea;
  case 0x37:
    _cpio.format = "bin";
    goto LAB_001097ea;
  case 0x41:
    _cpio.option_append = 1;
    goto LAB_001097ea;
  case 0x42:
    _cpio.bytes_per_block = 0x1400;
    iVar4 = _cpio.bytes_per_block;
    goto LAB_001097ea;
  case 0x43:
    piVar6 = __errno_location();
    *piVar6 = 0;
    tptr = (char *)0x0;
    lVar7 = strtol(_cpio.argument,&tptr,10);
    if ((((*piVar6 != 0) || ((int)lVar7 < 1)) || (*_cpio.argument == '\0')) ||
       ((tptr == (char *)0x0 || (iVar4 = (int)lVar7, *tptr != '\0')))) {
      pcVar5 = "Invalid blocksize: %s";
      goto LAB_0010a2b4;
    }
    goto LAB_001097ea;
  case 0x45:
    wVar3 = archive_match_include_pattern_from_file
                      (_cpio.matching,_cpio.argument,(int)_cpio.option_null);
    goto LAB_001099f1;
  case 0x46:
  case 0x49:
  case 0x4f:
    _cpio.filename = _cpio.argument;
    goto LAB_001097ea;
  case 0x48:
    _cpio.format = _cpio.argument;
    goto LAB_001097ea;
  case 0x4a:
    _cpio.compress = 0x4a;
    goto LAB_001097ea;
  case 0x4c:
    _cpio.option_follow_links = 1;
    goto LAB_001097ea;
  case 0x52:
    errmsg = (char *)0x0;
    iVar4 = owner_parse(_cpio.argument,&owner,&errmsg);
    if (iVar4 != 0) {
      if (errmsg == (char *)0x0) {
        errmsg = "Error parsing owner";
      }
      lafe_warnc(-1,"%s");
      usage();
    }
    if (owner.uid != -1) {
      _cpio.uid_override = owner.uid;
    }
    if (owner.uname != (char *)0x0) {
      _cpio.uname_override = owner.uname;
    }
    if (owner.gid != -1) {
      _cpio.gid_override = owner.gid;
    }
    iVar4 = _cpio.bytes_per_block;
    if (owner.gname != (char *)0x0) {
      _cpio.gname_override = owner.gname;
    }
    goto LAB_001097ea;
  case 0x56:
    _cpio.dot = _cpio.dot + 1;
    goto LAB_001097ea;
  case 0x5a:
    _cpio.compress = 0x5a;
    goto LAB_001097ea;
  case 0x61:
    _cpio.option_atime_restore = 1;
    goto LAB_001097ea;
  case 99:
    _cpio.format = "odc";
    goto LAB_001097ea;
  case 100:
    _cpio.extract_flags = _cpio.extract_flags & 0xfffffbff;
    goto LAB_001097ea;
  case 0x66:
    wVar3 = archive_match_exclude_pattern(_cpio.matching,_cpio.argument);
LAB_001099f1:
    iVar4 = _cpio.bytes_per_block;
    if (wVar3 != L'\0') goto LAB_0010a298;
    goto LAB_001097ea;
  case 0x68:
    long_help();
  case 0x69:
    if (_cpio.mode == 0) {
      _cpio.mode = 0x69;
      goto LAB_001097ea;
    }
    pcVar5 = "Cannot use both -i and -%c";
    break;
  case 0x6a:
    _cpio.compress = 0x6a;
    goto LAB_001097ea;
  case 0x6c:
    _cpio.option_link = 1;
    goto LAB_001097ea;
  case 0x6d:
    _cpio.extract_flags = _cpio.extract_flags | 4;
    goto LAB_001097ea;
  case 0x6e:
    _cpio.option_numeric_uid_gid = 1;
    goto LAB_001097ea;
  case 0x6f:
    if (_cpio.mode == 0) {
      _cpio.mode = 0x6f;
      goto LAB_001097ea;
    }
    pcVar5 = "Cannot use both -o and -%c";
    break;
  case 0x70:
    if (_cpio.mode == 0) {
      _cpio.mode = 0x70;
      _cpio.extract_flags = _cpio.extract_flags & 0xfffefdff;
      goto LAB_001097ea;
    }
    pcVar5 = "Cannot use both -p and -%c";
    break;
  case 0x72:
    _cpio.option_rename = 1;
    goto LAB_001097ea;
  case 0x74:
    _cpio.option_list = 1;
    goto LAB_001097ea;
  case 0x75:
    _cpio.extract_flags = _cpio.extract_flags & 0xfffff7ff;
    goto LAB_001097ea;
  case 0x76:
    _cpio.verbose = _cpio.verbose + 1;
    goto LAB_001097ea;
  case 0x79:
    _cpio.compress = 0x79;
    goto LAB_001097ea;
  case 0x7a:
    _cpio.compress = 0x7a;
    goto LAB_001097ea;
  default:
    switch(iVar2) {
    default:
      goto switchD_00109801_caseD_31;
    case 1:
      _cpio.add_filter = 1;
      break;
    case 2:
      _cpio.compress = 2;
      break;
    case 3:
      _cpio.extract_flags = _cpio.extract_flags & 0xfffefcff;
      break;
    case 4:
    case 5:
    case 6:
    case 7:
    case 0xe:
      _cpio.compress = iVar2;
      break;
    case 8:
      _cpio.passphrase = _cpio.argument;
      break;
    case 9:
      _cpio.extract_flags = _cpio.extract_flags & 0xfffffffe;
      break;
    case 10:
      _cpio.extract_flags = _cpio.extract_flags | 1;
      break;
    case 0xb:
      _cpio.quiet = 1;
      break;
    case 0xc:
      _cpio.add_filter = 0xc;
      break;
    case 0xd:
      version();
    case -1:
      if (_cpio.mode == 0 && _cpio.option_list != 0) {
        _cpio.mode = 0x69;
      }
      else {
        if (_cpio.mode != 0x69 && _cpio.option_list != 0) {
          pcVar5 = "Option -t requires -i";
          goto LAB_0010a2f8;
        }
        if ((_cpio.option_list == 0) && (_cpio.option_numeric_uid_gid != 0)) {
          pcVar5 = "Option -n requires -it";
          goto LAB_0010a2f8;
        }
      }
      if (_cpio.mode != 0x6f && _cpio.format != (char *)0x0) {
        pcVar5 = "Option --format requires -o";
        goto LAB_0010a2f8;
      }
      if (_cpio.mode != 0x70 && _cpio.option_link != 0) {
        pcVar5 = "Option -l requires -p";
        goto LAB_0010a2f8;
      }
      if ((_cpio.dot != 0) && (_cpio.verbose != 0)) {
        _cpio.dot = 0;
      }
      if (_cpio.mode == 0x6f) {
        if ((_cpio.format == (char *)0x0) && (_cpio.format = "pwb", _cpio.option_pwb == 0)) {
          _cpio.format = "cpio";
        }
        if (_cpio.option_append != 0) {
          pcVar5 = "Append mode not yet supported.";
          goto LAB_0010a2f8;
        }
        _cpio.archive_read_disk = archive_read_disk_new();
        if (_cpio.archive_read_disk != (archive *)0x0) {
          if (_cpio.option_follow_links == 0) {
            archive_read_disk_set_symlink_physical(_cpio.archive_read_disk);
          }
          else {
            archive_read_disk_set_symlink_logical(_cpio.archive_read_disk);
          }
          archive_read_disk_set_standard_lookup(_cpio.archive_read_disk);
          _cpio.archive = archive_write_new();
          if (_cpio.archive != (archive *)0x0) {
            switch(_cpio.compress) {
            case 2:
              wVar3 = archive_write_add_filter_grzip(_cpio.archive);
              break;
            case 3:
            case 8:
            case 9:
            case 10:
            case 0xb:
            case 0xc:
            case 0xd:
switchD_00109d3a_caseD_3:
              wVar3 = archive_write_add_filter_none(_cpio.archive);
              break;
            case 4:
              wVar3 = archive_write_add_filter_lrzip(_cpio.archive);
              break;
            case 5:
              wVar3 = archive_write_add_filter_lz4(_cpio.archive);
              break;
            case 6:
              wVar3 = archive_write_add_filter_lzma(_cpio.archive);
              break;
            case 7:
              wVar3 = archive_write_add_filter_lzop(_cpio.archive);
              break;
            case 0xe:
              wVar3 = archive_write_add_filter_zstd(_cpio.archive);
              break;
            default:
              if (_cpio.compress == 0x4a) {
                wVar3 = archive_write_add_filter_xz(_cpio.archive);
              }
              else if (_cpio.compress == 0x5a) {
                wVar3 = archive_write_add_filter_compress(_cpio.archive);
              }
              else if ((_cpio.compress == 0x6a) || (_cpio.compress == 0x79)) {
                wVar3 = archive_write_add_filter_bzip2(_cpio.archive);
              }
              else {
                if (_cpio.compress != 0x7a) goto switchD_00109d3a_caseD_3;
                wVar3 = archive_write_add_filter_gzip(_cpio.archive);
              }
            }
            if (wVar3 < L'\xffffffec') {
              pcVar5 = "Requested compression not available";
              goto LAB_0010a2f8;
            }
            if (_cpio.add_filter == 0xc) {
              wVar3 = archive_write_add_filter_uuencode(_cpio.archive);
LAB_00109ec3:
              if (wVar3 < L'\xffffffec') {
                pcVar5 = "Requested filter not available";
                goto LAB_0010a2f8;
              }
            }
            else if (_cpio.add_filter == 1) {
              wVar3 = archive_write_add_filter_b64encode(_cpio.archive);
              goto LAB_00109ec3;
            }
            iVar4 = archive_write_set_format_by_name(_cpio.archive,_cpio.format);
            if (iVar4 == 0) {
              archive_write_set_bytes_per_block(_cpio.archive,_cpio.bytes_per_block);
              res = archive_entry_linkresolver_new();
              _cpio.linkresolver = res;
              iVar4 = archive_format(_cpio.archive);
              archive_entry_linkresolver_set_strategy(res,iVar4);
              if (_cpio.passphrase == (char *)0x0) {
                iVar4 = archive_write_set_passphrase_callback
                                  (_cpio.archive,&_cpio,passphrase_callback);
              }
              else {
                iVar4 = archive_write_set_passphrase(_cpio.archive,_cpio.passphrase);
              }
              if ((iVar4 == 0) &&
                 (wVar3 = archive_write_open_filename(_cpio.archive,_cpio.filename), wVar3 == L'\0')
                 ) {
                plVar8 = lafe_line_reader("-",(int)_cpio.option_null);
                while (pcVar5 = lafe_line_reader_next(plVar8), pcVar5 != (char *)0x0) {
                  file_to_archive(&_cpio,pcVar5);
                }
                lafe_line_reader_free(plVar8);
                while( true ) {
                  local_d8 = (archive_entry *)0x0;
                  archive_entry_linkify(_cpio.linkresolver,&local_d8,&local_c0);
                  if (local_d8 == (archive_entry *)0x0) break;
                  entry_to_archive(&_cpio,local_d8);
                  archive_entry_free(local_d8);
                }
                iVar4 = archive_write_close(_cpio.archive);
                if (_cpio.dot != 0) {
                  fputc(10,_stderr);
                }
                if (iVar4 == 0) {
                  if (_cpio.quiet == 0) {
                    lVar9 = archive_filter_bytes(_cpio.archive,0);
                    pcVar5 = "blocks";
                    if (lVar9 - 1U < 0x200) {
                      pcVar5 = "block";
                    }
                    fprintf(_stderr,"%lu %s\n",(lVar9 + 0x1ff) / 0x200,pcVar5);
                  }
                  archive_write_free(_cpio.archive);
                  archive_entry_linkresolver_free(_cpio.linkresolver);
LAB_0010a051:
                  archive_match_free(_cpio.matching);
                  free_cache(_cpio.uname_cache);
                  free(_cpio.uname_override);
                  free_cache(_cpio.gname_cache);
                  free(_cpio.gname_override);
                  archive_read_close(_cpio.archive_read_disk);
                  archive_read_free(_cpio.archive_read_disk);
                  free(_cpio.destdir);
                  free(_cpio.ppbuff);
                  return _cpio.return_value;
                }
              }
            }
LAB_0010a218:
            _cpio.argument = archive_error_string(_cpio.archive);
            pcVar5 = "%s";
            goto LAB_0010a2b4;
          }
        }
      }
      else {
        if (_cpio.mode != 0x70) {
          if (_cpio.mode == 0x69) goto LAB_0010a25e;
          pcVar5 = "Must specify at least one of -i, -o, or -p";
          goto LAB_0010a2f8;
        }
        pcVar5 = *_cpio.argv;
        if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) {
          pcVar5 = "-p mode requires a target directory";
          goto LAB_0010a2f8;
        }
        __n = strlen(pcVar5);
        _cpio.destdir_len = __n;
        __dest = (char *)malloc(__n + 8);
        _cpio.destdir = __dest;
        memcpy(__dest,pcVar5,__n);
        if ((__n == 0) || (pcVar5[__n - 1] != '/')) {
          __dest[__n] = '/';
          __n = __n + 1;
          _cpio.destdir_len = __n;
        }
        __dest[__n] = '\0';
        _cpio.archive = archive_write_disk_new();
        if (_cpio.archive != (archive *)0x0) {
          wVar3 = archive_write_disk_set_options(_cpio.archive,_cpio.extract_flags);
          if (wVar3 != L'\0') goto LAB_0010a218;
          _cpio.linkresolver = archive_entry_linkresolver_new();
          archive_write_disk_set_standard_lookup(_cpio.archive);
          _cpio.archive_read_disk = archive_read_disk_new();
          if (_cpio.archive_read_disk != (archive *)0x0) {
            if (_cpio.option_follow_links == 0) {
              archive_read_disk_set_symlink_physical(_cpio.archive_read_disk);
            }
            else {
              archive_read_disk_set_symlink_logical(_cpio.archive_read_disk);
            }
            archive_read_disk_set_standard_lookup(_cpio.archive_read_disk);
            plVar8 = lafe_line_reader("-",(int)_cpio.option_null);
            while (pcVar5 = lafe_line_reader_next(plVar8), pcVar5 != (char *)0x0) {
              file_to_archive(&_cpio,pcVar5);
            }
            lafe_line_reader_free(plVar8);
            archive_entry_linkresolver_free(_cpio.linkresolver);
            iVar4 = archive_write_close(_cpio.archive);
            if (_cpio.dot != 0) {
              fputc(10,_stderr);
            }
            if (iVar4 == 0) {
              if (_cpio.quiet == 0) {
                lVar9 = archive_filter_bytes(_cpio.archive,0);
                pcVar5 = "blocks";
                if (lVar9 - 1U < 0x200) {
                  pcVar5 = "block";
                }
                fprintf(_stderr,"%lu %s\n",(lVar9 + 0x1ff) / 0x200,pcVar5);
              }
              archive_write_free(_cpio.archive);
              free(_cpio.pass_destpath);
              goto LAB_0010a051;
            }
            goto LAB_0010a218;
          }
        }
      }
      pcVar5 = "Failed to allocate archive object";
      goto LAB_0010a2f8;
    }
    goto LAB_001097ea;
  }
  lafe_errc(1,0,pcVar5);
LAB_0010a25e:
  while( true ) {
    if (*_cpio.argv == (char *)0x0) {
      if (_cpio.option_list == 0) {
        mode_in(&_cpio);
      }
      mode_list(&_cpio);
    }
    wVar3 = archive_match_include_pattern(_cpio.matching,*_cpio.argv);
    if (wVar3 != L'\0') break;
    _cpio.argc = _cpio.argc + -1;
    _cpio.argv = _cpio.argv + 1;
  }
LAB_0010a298:
  _cpio.argument = archive_error_string(_cpio.matching);
  pcVar5 = "Error : %s";
LAB_0010a2b4:
  lafe_errc(1,0,pcVar5,_cpio.argument);
}

Assistant:

int
main(int argc, char *argv[])
{
	static char buff[16384];
	struct cpio _cpio; /* Allocated on stack. */
	struct cpio *cpio;
	struct cpio_owner owner;
	const char *errmsg;
	char *tptr;
	int opt, t;

	cpio = &_cpio;
	memset(cpio, 0, sizeof(*cpio));
	cpio->buff = buff;
	cpio->buff_size = sizeof(buff);


#if defined(HAVE_SIGACTION) && defined(SIGPIPE)
	{ /* Ignore SIGPIPE signals. */
		struct sigaction sa;
		sigemptyset(&sa.sa_mask);
		sa.sa_flags = 0;
		sa.sa_handler = SIG_IGN;
		sigaction(SIGPIPE, &sa, NULL);
	}
#endif

	/* Set lafe_progname before calling lafe_warnc. */
	lafe_setprogname(*argv, "bsdcpio");

#if HAVE_SETLOCALE
	if (setlocale(LC_ALL, "") == NULL)
		lafe_warnc(0, "Failed to set default locale");
#endif

	cpio->uid_override = -1;
	cpio->uname_override = NULL;
	cpio->gid_override = -1;
	cpio->gname_override = NULL;
	cpio->argv = argv;
	cpio->argc = argc;
	cpio->mode = '\0';
	cpio->verbose = 0;
	cpio->compress = '\0';
	cpio->extract_flags = ARCHIVE_EXTRACT_NO_AUTODIR;
	cpio->extract_flags |= ARCHIVE_EXTRACT_NO_OVERWRITE_NEWER;
	cpio->extract_flags |= ARCHIVE_EXTRACT_SECURE_SYMLINKS;
	cpio->extract_flags |= ARCHIVE_EXTRACT_SECURE_NODOTDOT;
	cpio->extract_flags |= ARCHIVE_EXTRACT_SECURE_NOABSOLUTEPATHS;
	cpio->extract_flags |= ARCHIVE_EXTRACT_PERM;
	cpio->extract_flags |= ARCHIVE_EXTRACT_FFLAGS;
	cpio->extract_flags |= ARCHIVE_EXTRACT_ACL;
#if !defined(_WIN32) && !defined(__CYGWIN__)
	if (geteuid() == 0)
		cpio->extract_flags |= ARCHIVE_EXTRACT_OWNER;
#endif
	cpio->bytes_per_block = 512;
	cpio->filename = NULL;

	cpio->matching = archive_match_new();
	if (cpio->matching == NULL)
		lafe_errc(1, 0, "Out of memory");

	while ((opt = cpio_getopt(cpio)) != -1) {
		switch (opt) {
		case '0': /* GNU convention: --null, -0 */
			cpio->option_null = 1;
			break;
		case '6': /* in/out: assume/create 6th edition (PWB) format */
			cpio->option_pwb = 1;
			break;
		case '7': /* out: create archive using 7th Edition binary format */
			cpio->format = "bin";
			break;
		case 'A': /* NetBSD/OpenBSD */
			cpio->option_append = 1;
			break;
		case 'a': /* POSIX 1997 */
			cpio->option_atime_restore = 1;
			break;
		case 'B': /* POSIX 1997 */
			cpio->bytes_per_block = 5120;
			break;
		case OPTION_B64ENCODE:
			cpio->add_filter = opt;
			break;
		case 'C': /* NetBSD/OpenBSD */
			errno = 0;
			tptr = NULL;
			t = (int)strtol(cpio->argument, &tptr, 10);
			if (errno || t <= 0 || *(cpio->argument) == '\0' ||
			    tptr == NULL || *tptr != '\0') {
				lafe_errc(1, 0, "Invalid blocksize: %s",
				    cpio->argument);
			}
			cpio->bytes_per_block = t;
			break;
		case 'c': /* POSIX 1997 */
			cpio->format = "odc";
			break;
		case 'd': /* POSIX 1997 */
			cpio->extract_flags &= ~ARCHIVE_EXTRACT_NO_AUTODIR;
			break;
		case 'E': /* NetBSD/OpenBSD */
			if (archive_match_include_pattern_from_file(
			    cpio->matching, cpio->argument,
			    cpio->option_null) != ARCHIVE_OK)
				lafe_errc(1, 0, "Error : %s",
				    archive_error_string(cpio->matching));
			break;
		case 'F': /* NetBSD/OpenBSD/GNU cpio */
			cpio->filename = cpio->argument;
			break;
		case 'f': /* POSIX 1997 */
			if (archive_match_exclude_pattern(cpio->matching,
			    cpio->argument) != ARCHIVE_OK)
				lafe_errc(1, 0, "Error : %s",
				    archive_error_string(cpio->matching));
			break;
		case OPTION_GRZIP:
			cpio->compress = opt;
			break;
		case 'H': /* GNU cpio (also --format) */
			cpio->format = cpio->argument;
			break;
		case 'h':
			long_help();
			/* NOTREACHED */
		case 'I': /* NetBSD/OpenBSD */
			cpio->filename = cpio->argument;
			break;
		case 'i': /* POSIX 1997 */
			if (cpio->mode != '\0')
				lafe_errc(1, 0,
				    "Cannot use both -i and -%c", cpio->mode);
			cpio->mode = opt;
			break;
		case 'J': /* GNU tar, others */
			cpio->compress = opt;
			break;
		case 'j': /* GNU tar, others */
			cpio->compress = opt;
			break;
		case OPTION_INSECURE:
			cpio->extract_flags &= ~ARCHIVE_EXTRACT_SECURE_SYMLINKS;
			cpio->extract_flags &= ~ARCHIVE_EXTRACT_SECURE_NODOTDOT;
			cpio->extract_flags &= ~ARCHIVE_EXTRACT_SECURE_NOABSOLUTEPATHS;
			break;
		case 'L': /* GNU cpio */
			cpio->option_follow_links = 1;
			break;
		case 'l': /* POSIX 1997 */
			cpio->option_link = 1;
			break;
		case OPTION_LRZIP:
		case OPTION_LZ4:
		case OPTION_LZMA: /* GNU tar, others */
		case OPTION_LZOP: /* GNU tar, others */
		case OPTION_ZSTD:
			cpio->compress = opt;
			break;
		case 'm': /* POSIX 1997 */
			cpio->extract_flags |= ARCHIVE_EXTRACT_TIME;
			break;
		case 'n': /* GNU cpio */
			cpio->option_numeric_uid_gid = 1;
			break;
		case OPTION_NO_PRESERVE_OWNER: /* GNU cpio */
			cpio->extract_flags &= ~ARCHIVE_EXTRACT_OWNER;
			break;
		case 'O': /* GNU cpio */
			cpio->filename = cpio->argument;
			break;
		case 'o': /* POSIX 1997 */
			if (cpio->mode != '\0')
				lafe_errc(1, 0,
				    "Cannot use both -o and -%c", cpio->mode);
			cpio->mode = opt;
			break;
		case 'p': /* POSIX 1997 */
			if (cpio->mode != '\0')
				lafe_errc(1, 0,
				    "Cannot use both -p and -%c", cpio->mode);
			cpio->mode = opt;
			cpio->extract_flags &= ~ARCHIVE_EXTRACT_SECURE_NODOTDOT;
			cpio->extract_flags &= ~ARCHIVE_EXTRACT_SECURE_NOABSOLUTEPATHS;
			break;
		case OPTION_PASSPHRASE:
			cpio->passphrase = cpio->argument;
			break;
		case OPTION_PRESERVE_OWNER:
			cpio->extract_flags |= ARCHIVE_EXTRACT_OWNER;
			break;
		case OPTION_QUIET: /* GNU cpio */
			cpio->quiet = 1;
			break;
		case 'R': /* GNU cpio, also --owner */
			errmsg = NULL;
			if (owner_parse(cpio->argument, &owner, &errmsg) != 0) {
				if (!errmsg)
					errmsg = "Error parsing owner";
				lafe_warnc(-1, "%s", errmsg);
				usage();
			}
			if (owner.uid != -1)
				cpio->uid_override = owner.uid;
			if (owner.uname != NULL)
				cpio->uname_override = owner.uname;
			if (owner.gid != -1)
				cpio->gid_override = owner.gid;
			if (owner.gname != NULL)
				cpio->gname_override = owner.gname;
			break;
		case 'r': /* POSIX 1997 */
			cpio->option_rename = 1;
			break;
		case 't': /* POSIX 1997 */
			cpio->option_list = 1;
			break;
		case 'u': /* POSIX 1997 */
			cpio->extract_flags
			    &= ~ARCHIVE_EXTRACT_NO_OVERWRITE_NEWER;
			break;
		case OPTION_UUENCODE:
			cpio->add_filter = opt;
			break;
		case 'v': /* POSIX 1997 */
			cpio->verbose++;
			break;
		case 'V': /* GNU cpio */
			cpio->dot++;
			break;
		case OPTION_VERSION: /* GNU convention */
			version();
			/* NOTREACHED */
#if 0
	        /*
		 * cpio_getopt() handles -W specially, so it's not
		 * available here.
		 */
		case 'W': /* Obscure, but useful GNU convention. */
			break;
#endif
		case 'y': /* tar convention */
			cpio->compress = opt;
			break;
		case 'Z': /* tar convention */
			cpio->compress = opt;
			break;
		case 'z': /* tar convention */
			cpio->compress = opt;
			break;
		default:
			usage();
		}
	}

	/*
	 * Sanity-check args, error out on nonsensical combinations.
	 */
	/* -t implies -i if no mode was specified. */
	if (cpio->option_list && cpio->mode == '\0')
		cpio->mode = 'i';
	/* -t requires -i */
	if (cpio->option_list && cpio->mode != 'i')
		lafe_errc(1, 0, "Option -t requires -i");
	/* -n requires -it */
	if (cpio->option_numeric_uid_gid && !cpio->option_list)
		lafe_errc(1, 0, "Option -n requires -it");
	/* Can only specify format when writing */
	if (cpio->format != NULL && cpio->mode != 'o')
		lafe_errc(1, 0, "Option --format requires -o");
	/* -l requires -p */
	if (cpio->option_link && cpio->mode != 'p')
		lafe_errc(1, 0, "Option -l requires -p");
	/* -v overrides -V */
	if (cpio->dot && cpio->verbose)
		cpio->dot = 0;
	/* TODO: Flag other nonsensical combinations. */

	switch (cpio->mode) {
	case 'o':
		if (cpio->format == NULL) {
			if (cpio->option_pwb)
				cpio->format = "pwb";
			else
				cpio->format = "cpio";
		}
		mode_out(cpio);
		break;
	case 'i':
		while (*cpio->argv != NULL) {
			if (archive_match_include_pattern(cpio->matching,
			    *cpio->argv) != ARCHIVE_OK)
				lafe_errc(1, 0, "Error : %s",
				    archive_error_string(cpio->matching));
			--cpio->argc;
			++cpio->argv;
		}
		if (cpio->option_list)
			mode_list(cpio);
		else
			mode_in(cpio);
		/* NOTREACHED */
	case 'p':
		if (*cpio->argv == NULL || **cpio->argv == '\0')
			lafe_errc(1, 0,
			    "-p mode requires a target directory");
		mode_pass(cpio, *cpio->argv);
		break;
	default:
		lafe_errc(1, 0,
		    "Must specify at least one of -i, -o, or -p");
	}

	archive_match_free(cpio->matching);
	free_cache(cpio->uname_cache);
	free(cpio->uname_override);
	free_cache(cpio->gname_cache);
	free(cpio->gname_override);
	archive_read_close(cpio->archive_read_disk);
	archive_read_free(cpio->archive_read_disk);
	free(cpio->destdir);

	passphrase_free(cpio->ppbuff);
	return (cpio->return_value);
}